

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O2

int yyparse(s98c *ctx,void *scanner)

{
  size_t __n;
  char cVar1;
  yytype_int8 yVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte *__dest;
  char *pcVar6;
  byte value;
  int iVar7;
  yytype_int8 *pyVar8;
  YYSTYPE *pYVar9;
  char *pcVar10;
  uint uVar11;
  YYSTYPE *__dest_00;
  byte addr;
  uint32_t num;
  long lVar12;
  YYSTYPE *__dest_01;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  byte *pbVar16;
  byte *pbVar17;
  YYSTYPE *local_14f8;
  char *yymsg;
  int local_14cc;
  byte *local_14c8;
  long yymsg_alloc;
  void *local_14b8;
  YYSTYPE yylval;
  YYLTYPE yylloc;
  YYSTYPE *local_1488;
  YYSTYPE *local_1480;
  YYSTYPE local_1478;
  YYSTYPE YStack_1470;
  yypcontext_t yyctx;
  char yymsgbuf [128];
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  YYLTYPE yylsa [200];
  
  yylval.s = (char *)0x0;
  yylloc = yyparse::yyloc_default;
  yymsg = yymsgbuf;
  yymsg_alloc = 0x80;
  pYVar9 = (YYSTYPE *)yylsa;
  yylsa[0] = yyparse::yyloc_default;
  uVar3 = 0xfffffffe;
  uVar14 = 0;
  lVar12 = 200;
  pbVar17 = (byte *)yyssa;
  local_14f8 = yyvsa;
  local_14cc = 1;
  pbVar16 = pbVar17;
  local_14b8 = scanner;
  local_1488 = local_14f8;
  local_1480 = pYVar9;
  do {
    *pbVar16 = (byte)uVar14;
    __dest = pbVar17;
    if (pbVar17 + lVar12 + -1 <= pbVar16) {
      if (lVar12 < 10000) {
        lVar12 = lVar12 * 2;
        if (9999 < lVar12) {
          lVar12 = 10000;
        }
        __dest = (byte *)malloc(lVar12 * 0x19 + 0x1e);
        if (__dest != (byte *)0x0) {
          lVar13 = (long)pbVar16 - (long)pbVar17;
          __n = lVar13 + 1;
          local_14c8 = pbVar17;
          memcpy(__dest,pbVar17,__n);
          __dest_01 = (YYSTYPE *)(__dest + ((lVar12 + 0xf) / 0x10) * 0x10);
          memcpy(__dest_01,local_1488,__n * 8);
          __dest_00 = __dest_01 + ((lVar12 * 8 + 0xf) / 0x10) * 2;
          memcpy(__dest_00,local_1480,__n * 0x10);
          if (local_14c8 != (byte *)yyssa) {
            free(local_14c8);
          }
          pbVar16 = __dest + lVar13;
          local_14f8 = __dest_01 + lVar13;
          pbVar17 = pbVar16;
          if ((long)__n < lVar12) {
            pYVar9 = __dest_00 + __n * 2 + -2;
            local_1488 = __dest_01;
            local_1480 = __dest_00;
            goto LAB_00103372;
          }
          goto LAB_001038f8;
        }
      }
LAB_00103887:
      __dest = pbVar17;
      yyerror(&yylloc,ctx,local_14b8,"memory exhausted");
      local_14cc = 2;
      pbVar17 = pbVar16;
      goto LAB_001038f8;
    }
LAB_00103372:
    if ((int)uVar14 == 2) {
      local_14cc = 0;
      pbVar17 = pbVar16;
      goto LAB_001038f8;
    }
    uVar15 = (ulong)(int)uVar14;
    pbVar17 = __dest;
    if ((0x5eabbf2c760dU >> (uVar14 & 0x3f) & 1) == 0) {
      cVar1 = yypact[uVar15];
      if (uVar3 == 0xfffffffe) {
        uVar3 = yylex(&yylval,&yylloc,local_14b8);
      }
      if ((int)uVar3 < 1) {
        iVar4 = 0;
        uVar3 = 0;
      }
      else {
        if (uVar3 == 0x100) {
          uVar3 = 0x101;
          goto LAB_001038b7;
        }
        if (uVar3 < 0x117) {
          iVar4 = (int)""[uVar3];
        }
        else {
          iVar4 = 2;
        }
      }
      uVar11 = cVar1 + iVar4;
      if ((0x25 < uVar11) || (iVar4 != "\v\x10\x11\x12\x13\x14"[uVar11])) goto LAB_00103455;
      yVar2 = "\x1d\x19\x1a\x1b\x1c%\x02\x13\x14\x03\x16\x1f$\x04\x05\x06\a\b\t\n\v\f\x17\x18 +!\r\x19\x1a\x1b\x1c\"#.)-,"
              [uVar11];
      local_14f8[1] = yylval;
      pYVar9[2] = (YYSTYPE)yylloc._0_8_;
      pYVar9[3] = (YYSTYPE)yylloc._8_8_;
      uVar3 = 0xfffffffe;
      goto LAB_0010372d;
    }
LAB_00103455:
    if ((0x210440c381f2U >> (uVar15 & 0x3f) & 1) != 0) {
      if (uVar3 == 0xfffffffe) {
        yyctx.yytoken = YYSYMBOL_YYEMPTY;
      }
      else if (uVar3 < 0x117) {
        yyctx.yytoken = (yysymbol_kind_t)""[uVar3];
      }
      else {
        yyctx.yytoken = YYSYMBOL_YYUNDEF;
      }
      yyctx.yylloc = &yylloc;
      yyctx.yyssp = (yy_state_t *)pbVar16;
      iVar4 = yysyntax_error(&yymsg_alloc,&yymsg,&yyctx);
      pcVar10 = "syntax error";
      if (iVar4 == -1) {
        if (yymsg != yymsgbuf) {
          free(yymsg);
        }
        pcVar6 = (char *)malloc(yymsg_alloc);
        if (pcVar6 == (char *)0x0) {
          yymsg = yymsgbuf;
          yymsg_alloc = 0x80;
          iVar4 = -2;
        }
        else {
          yymsg = pcVar6;
          iVar4 = yysyntax_error(&yymsg_alloc,&yymsg,&yyctx);
          pcVar10 = pcVar6;
        }
      }
      else if (iVar4 == 0) {
        iVar4 = 0;
        pcVar10 = yymsg;
      }
      yyerror(&yylloc,ctx,local_14b8,pcVar10);
      if (iVar4 == -2) goto LAB_00103887;
      goto LAB_001038b7;
    }
    uVar14 = (ulong)"\x02"[uVar15];
    lVar13 = (long)""[uVar14];
    if ((0x28005UL >> (uVar14 & 0x3f) & 1) == 0) {
      local_1478 = pYVar9[lVar13 * -2 + 2];
      YStack_1470 = pYVar9[1];
    }
    else {
      YStack_1470 = pYVar9[1];
      local_1478 = pYVar9[1];
    }
    iVar4 = local_14f8[1 - lVar13].ts.numerator;
    iVar7 = *(int *)((long)local_14f8 + (1 - lVar13) * 8 + 4);
    local_14c8 = __dest;
    switch("\x02"[uVar15]) {
    case '\b':
      s98c_register_version(ctx,(local_14f8->ts).numerator);
      break;
    case '\t':
      s98c_register_timer(ctx,(local_14f8->ts).numerator,(local_14f8->ts).denominator);
      break;
    case '\n':
      iVar5 = s98c_register_tag(ctx,local_14f8[-1].s,local_14f8->s);
      goto LAB_0010368b;
    case '\v':
      iVar5 = s98c_register_device
                        (ctx,local_14f8[-2].s,local_14f8[-1].ts.numerator,(local_14f8->hp).addr);
      if (iVar5 == 0) {
        pcVar10 = local_14f8[-2].s;
        goto LAB_0010364a;
      }
LAB_00103792:
      local_14f8 = local_14f8 + -lVar13;
      pbVar16 = pbVar16 + -lVar13;
      uVar14 = (ulong)(uint)(int)(char)*pbVar16;
      __dest = local_14c8;
LAB_001038b7:
      for (; pbVar17 = __dest, pbVar16 != __dest; pbVar16 = pbVar16 + -1) {
        if ((0x801c00000U >> (uVar14 & 0x3f) & 1) != 0) {
          free(local_14f8->s);
        }
        local_14f8 = local_14f8 + -1;
        uVar14 = (ulong)(uint)(int)(char)pbVar16[-1];
      }
LAB_001038f8:
      if (uVar3 - 0x115 < 2) {
        free(yylval.s);
      }
      for (; pbVar17 != __dest; pbVar17 = pbVar17 + -1) {
        if ((0x801c00000U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0) {
          free(local_14f8->s);
        }
        local_14f8 = local_14f8 + -1;
      }
      if (__dest != (byte *)yyssa) {
        free(__dest);
      }
      if (yymsg != yymsgbuf) {
        free(yymsg);
      }
      return local_14cc;
    case '\f':
      iVar5 = s98c_register_encoding(ctx,local_14f8->s);
      if (iVar5 != 0) goto LAB_00103792;
      pcVar10 = local_14f8->s;
LAB_0010364a:
      free(pcVar10);
      break;
    case '\r':
      iVar4 = local_14f8[-2].ts.numerator;
      iVar7 = (local_14f8->ts).numerator;
      break;
    case '\x0e':
      iVar4 = (local_14f8->ts).numerator;
      iVar7 = 1000;
      break;
    case '\x0f':
      iVar4 = -1;
      break;
    case '\x11':
      iVar5 = s98c_set_part(ctx,(local_14f8->ts).numerator);
      goto LAB_0010368b;
    case '\x15':
      addr = (local_14f8->hp).addr;
      value = (local_14f8->hp).val;
      goto LAB_00103662;
    case '\x16':
      addr = local_14f8[-2].hp.addr;
      value = (local_14f8->hp).addr;
LAB_00103662:
      s98c_write_reg(ctx,addr,value);
      break;
    case '\x18':
      s98c_set_loopstart(ctx);
      break;
    case '\x19':
      s98c_write(ctx,0xfd);
      break;
    case '\x1a':
      iVar5 = s98c_set_dumpstart(ctx);
LAB_0010368b:
      if (iVar5 != 0) goto LAB_00103792;
      break;
    case '\x1b':
      num = 1;
      goto LAB_001035f4;
    case '\x1c':
      num = (local_14f8->ts).numerator;
LAB_001035f4:
      s98c_write_sync_n(ctx,num);
    }
    local_14f8 = local_14f8 + -lVar13;
    pbVar16 = pbVar16 + -lVar13;
    pYVar9 = pYVar9 + lVar13 * -2;
    local_14f8[1].ts.numerator = iVar4;
    *(int *)((long)local_14f8 + 0xc) = iVar7;
    pYVar9[2] = local_1478;
    pYVar9[3] = YStack_1470;
    uVar11 = (int)""[(long)""[uVar14] + 9] + (int)(char)*pbVar16;
    if ((uVar11 < 0x26) && ("\v\x10\x11\x12\x13\x14"[uVar11] == *pbVar16)) {
      pyVar8 = "\x1d\x19\x1a\x1b\x1c%\x02\x13\x14\x03\x16\x1f$\x04\x05\x06\a\b\t\n\v\f\x17\x18 +!\r\x19\x1a\x1b\x1c\"#.)-,"
               + uVar11;
    }
    else {
      pyVar8 = "" + (long)""[uVar14] + 0x16;
    }
    yVar2 = *pyVar8;
    pbVar17 = local_14c8;
LAB_0010372d:
    local_14f8 = local_14f8 + 1;
    pYVar9 = pYVar9 + 2;
    uVar14 = (ulong)(uint)(int)yVar2;
    pbVar16 = pbVar16 + 1;
  } while( true );
}

Assistant:

int
yyparse (struct s98c* ctx, void* scanner)
{
/* Lookahead token kind.  */
int yychar;


/* The semantic value of the lookahead symbol.  */
/* Default value used for initialization, for pacifying older GCCs
   or non-GCC compilers.  */
YY_INITIAL_VALUE (static YYSTYPE yyval_default;)
YYSTYPE yylval YY_INITIAL_VALUE (= yyval_default);

/* Location data for the lookahead symbol.  */
static YYLTYPE yyloc_default
# if defined YYLTYPE_IS_TRIVIAL && YYLTYPE_IS_TRIVIAL
  = { 1, 1, 1, 1 }
# endif
;
YYLTYPE yylloc = yyloc_default;

    /* Number of syntax errors so far.  */
    int yynerrs = 0;

    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex (&yylval, &yylloc, scanner);
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 8: /* directives: VERSION DEC  */
#line 74 "s98ml_parse.y"
                                { s98c_register_version(ctx, (yyvsp[0].n)); }
#line 1548 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 9: /* directives: TIMER timerspec  */
#line 75 "s98ml_parse.y"
                                { s98c_register_timer(ctx, (yyvsp[0].ts).numerator, (yyvsp[0].ts).denominator); }
#line 1554 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 10: /* directives: TAG SYMBOL STRING  */
#line 76 "s98ml_parse.y"
                                { if(s98c_register_tag(ctx, (yyvsp[-1].s), (yyvsp[0].s))) YYERROR; /*free($2); free($3);*/ }
#line 1560 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 11: /* directives: DEVICE SYMBOL num optional_num  */
#line 77 "s98ml_parse.y"
                                 { if(s98c_register_device(ctx, (yyvsp[-2].s), (yyvsp[-1].n), (yyvsp[0].n))) YYERROR; free((yyvsp[-2].s)); }
#line 1566 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 12: /* directives: ENCODING SYMBOL  */
#line 78 "s98ml_parse.y"
                                { if(s98c_register_encoding(ctx, (yyvsp[0].s))) YYERROR; free((yyvsp[0].s)); }
#line 1572 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 13: /* timerspec: DEC SLASH DEC  */
#line 81 "s98ml_parse.y"
                                { (yyval.ts).numerator = (yyvsp[-2].n); (yyval.ts).denominator = (yyvsp[0].n); }
#line 1578 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 14: /* timerspec: DEC  */
#line 82 "s98ml_parse.y"
                                { (yyval.ts).numerator = (yyvsp[0].n); (yyval.ts).denominator = DEFAULT_TIMER_DENOMINATOR; }
#line 1584 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 15: /* optional_num: %empty  */
#line 85 "s98ml_parse.y"
                                { (yyval.n) = -1; }
#line 1590 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 17: /* $@1: %empty  */
#line 89 "s98ml_parse.y"
                      { if(s98c_set_part(ctx, (yyvsp[0].n))) YYERROR; }
#line 1596 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 21: /* pair: HEX_PAIR  */
#line 96 "s98ml_parse.y"
                                { s98c_write_reg(ctx, (yyvsp[0].hp).addr, (yyvsp[0].hp).val); }
#line 1602 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 22: /* pair: num COMMA num  */
#line 97 "s98ml_parse.y"
                                { s98c_write_reg(ctx, (yyvsp[-2].n), (yyvsp[0].n)); }
#line 1608 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 24: /* commands: LOOP_START  */
#line 101 "s98ml_parse.y"
                                { s98c_set_loopstart(ctx); }
#line 1614 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 25: /* commands: LOOP_END  */
#line 102 "s98ml_parse.y"
                                { s98c_write(ctx, 0xfd); }
#line 1620 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 26: /* commands: DUMP_START  */
#line 103 "s98ml_parse.y"
                                { if(s98c_set_dumpstart(ctx)) YYERROR; }
#line 1626 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 27: /* sync: SYNC  */
#line 106 "s98ml_parse.y"
                                { s98c_write_sync_n(ctx, 1); }
#line 1632 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;

  case 28: /* sync: SYNC num  */
#line 107 "s98ml_parse.y"
                                { s98c_write_sync_n(ctx, (yyvsp[0].n)); }
#line 1638 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"
    break;


#line 1642 "/workspace/llm4binary/github/license_all_cmakelists_25/autch[P]s98ml/build_O2/s98ml_parse.c"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yytoken, &yylloc};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (&yylloc, ctx, scanner, yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, ctx, scanner);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, ctx, scanner);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (&yylloc, ctx, scanner, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, ctx, scanner);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, ctx, scanner);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}